

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_4,_2,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 *puVar1;
  int col;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  float v;
  float fVar5;
  undefined4 uVar6;
  undefined8 local_98;
  float afStack_90 [2];
  undefined8 local_88;
  Vector<float,_4> res;
  int aiStack_60 [6];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  res.m_data._8_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  puVar1 = &local_48;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar6 = 0;
      }
      *(undefined4 *)((long)puVar1 + lVar4) = uVar6;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  puVar1 = &local_48;
  local_48 = *(undefined8 *)evalCtx->in[0].m_data;
  uStack_40 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
  local_38 = *(undefined8 *)evalCtx->in[1].m_data;
  uStack_30 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  local_28 = *(undefined8 *)evalCtx->in[2].m_data;
  uStack_20 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  local_18 = *(undefined8 *)evalCtx->in[3].m_data;
  uStack_10 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  local_98 = 0;
  afStack_90[0] = 0.0;
  afStack_90[1] = 0.0;
  lVar2 = 0;
  do {
    fVar5 = 0.0;
    lVar3 = 0;
    do {
      fVar5 = fVar5 + *(float *)((long)puVar1 + lVar3 * 4) * res.m_data[lVar3 + 2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    *(float *)((long)&local_98 + lVar2 * 4) = fVar5;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 2;
  } while (lVar2 != 4);
  local_88 = local_98;
  res.m_data[0] = afStack_90[0] + afStack_90[1];
  aiStack_60[2] = 0;
  aiStack_60[3] = 1;
  aiStack_60[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_60[lVar2]] = afStack_90[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}